

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

char * doctest::failureString(Enum at)

{
  Enum at_local;
  char *local_8;
  
  if ((at & is_warn) == 0) {
    if ((at & is_check) == 0) {
      if ((at & is_require) == 0) {
        local_8 = "";
      }
      else {
        local_8 = "FATAL ERROR";
      }
    }
    else {
      local_8 = "ERROR";
    }
  }
  else {
    local_8 = "WARNING";
  }
  return local_8;
}

Assistant:

const char* failureString(assertType::Enum at) {
    if(at & assertType::is_warn) //!OCLINT bitwise operator in conditional
        return "WARNING";
    if(at & assertType::is_check) //!OCLINT bitwise operator in conditional
        return "ERROR";
    if(at & assertType::is_require) //!OCLINT bitwise operator in conditional
        return "FATAL ERROR";
    return "";
}